

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  byte *pbVar1;
  u8 uVar2;
  Vdbe *p;
  WhereLoop *pWVar3;
  Index *pIVar4;
  sqlite3 *db;
  ExprList *pEVar5;
  ExprList *pList;
  Expr *pExpr;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  Expr *pX;
  InLoop *pIVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  Expr *pEVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar40;
  int iVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar46 [16];
  ExprList *local_a8;
  ExprList *local_98;
  byte local_58;
  
  pEVar16 = pTerm->pExpr;
  uVar2 = pEVar16->op;
  if (uVar2 == '5') {
LAB_00182906:
    iTarget = sqlite3ExprCodeTarget(pParse,pEVar16->pRight,iTarget);
    goto LAB_00183123;
  }
  p = pParse->pVdbe;
  if (uVar2 == '2') {
    sqlite3VdbeAddOp3(p,0x49,0,iTarget,0);
    goto LAB_00183123;
  }
  if (uVar2 == '-') goto LAB_00182906;
  pWVar3 = pLevel->pWLoop;
  if ((((pWVar3->wsFlags & 0x400) == 0) &&
      (pIVar4 = (pWVar3->u).btree.pIndex, pIVar4 != (Index *)0x0)) &&
     (pIVar4->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  if (0 < iEq) {
    uVar14 = 0;
    do {
      if ((pWVar3->aLTerm[uVar14] != (WhereTerm *)0x0) && (pWVar3->aLTerm[uVar14]->pExpr == pEVar16)
         ) goto LAB_00183123;
      uVar14 = uVar14 + 1;
    } while ((uint)iEq != uVar14);
  }
  iVar15 = 0;
  if (iEq < (int)(uint)pWVar3->nLTerm) {
    uVar14 = (ulong)iEq;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + (uint)(pWVar3->aLTerm[uVar14]->pExpr == pEVar16);
      uVar14 = uVar14 + 1;
    } while (pWVar3->nLTerm != uVar14);
  }
  if (((pEVar16->flags & 0x800) == 0) || (((pEVar16->x).pSelect)->pEList->nExpr == 1)) {
    local_a8 = (ExprList *)0x0;
    iVar9 = sqlite3FindInIndex(pParse,pEVar16,4,(int *)0x0,(int *)0x0);
  }
  else {
    db = pParse->db;
    pX = exprDup(db,pEVar16,0,(u8 **)0x0);
    if (db->mallocFailed == '\0') {
      pEVar5 = ((pX->x).pSelect)->pEList;
      pList = (pX->pLeft->x).pList;
      uVar14 = (ulong)pWVar3->nLTerm;
      if (iEq < (int)(uint)pWVar3->nLTerm) {
        lVar17 = (long)iEq;
        local_a8 = (ExprList *)0x0;
        local_98 = (ExprList *)0x0;
        do {
          if (pWVar3->aLTerm[lVar17]->pExpr == pEVar16) {
            lVar19 = (long)pWVar3->aLTerm[lVar17]->iField;
            pExpr = pEVar5->a[lVar19 + -1].pExpr;
            if (pExpr != (Expr *)0x0) {
              local_a8 = sqlite3ExprListAppend((Parse *)pParse->db,local_a8,pExpr);
              pEVar5->a[lVar19 + -1].pExpr = (Expr *)0x0;
              local_98 = sqlite3ExprListAppend
                                   ((Parse *)pParse->db,local_98,pList->a[lVar19 + -1].pExpr);
              pList->a[lVar19 + -1].pExpr = (Expr *)0x0;
              uVar14 = (ulong)pWVar3->nLTerm;
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (long)uVar14);
      }
      else {
        local_98 = (ExprList *)0x0;
        local_a8 = (ExprList *)0x0;
      }
      if (pEVar5 != (ExprList *)0x0) {
        exprListDeleteNN(db,pEVar5);
      }
      if (pList != (ExprList *)0x0) {
        exprListDeleteNN(db,pList);
      }
      (pX->pLeft->x).pList = local_98;
      ((pX->x).pSelect)->pEList = local_a8;
      if ((local_98 != (ExprList *)0x0) && (local_98->nExpr == 1)) {
        pEVar16 = local_98->a[0].pExpr;
        local_98->a[0].pExpr = (Expr *)0x0;
        if (pX->pLeft != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pX->pLeft);
        }
        pX->pLeft = pEVar16;
      }
      auVar8 = _DAT_001940a0;
      pEVar5 = ((pX->x).pSelect)->pOrderBy;
      if (pEVar5 != (ExprList *)0x0) {
        iVar9 = pEVar5->nExpr;
        if (0 < (long)iVar9) {
          lVar17 = (long)iVar9 + -1;
          auVar20._8_4_ = (int)lVar17;
          auVar20._0_8_ = lVar17;
          auVar20._12_4_ = (int)((ulong)lVar17 >> 0x20);
          lVar17 = 0;
          auVar20 = auVar20 ^ _DAT_001940a0;
          auVar22 = _DAT_0019f480;
          auVar23 = _DAT_0019f490;
          auVar24 = _DAT_00194080;
          auVar25 = _DAT_00194090;
          do {
            auVar26 = auVar25 ^ auVar8;
            iVar40 = auVar20._0_4_;
            iVar39 = -(uint)(iVar40 < auVar26._0_4_);
            iVar10 = auVar20._4_4_;
            auVar27._4_4_ = -(uint)(iVar10 < auVar26._4_4_);
            iVar11 = auVar20._8_4_;
            iVar43 = -(uint)(iVar11 < auVar26._8_4_);
            iVar21 = auVar20._12_4_;
            auVar27._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
            auVar36._4_4_ = iVar39;
            auVar36._0_4_ = iVar39;
            auVar36._8_4_ = iVar43;
            auVar36._12_4_ = iVar43;
            auVar44 = pshuflw(in_XMM11,auVar36,0xe8);
            auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar10);
            auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
            auVar29._0_4_ = auVar29._4_4_;
            auVar29._8_4_ = auVar29._12_4_;
            auVar46 = pshuflw(in_XMM12,auVar29,0xe8);
            auVar27._0_4_ = auVar27._4_4_;
            auVar27._8_4_ = auVar27._12_4_;
            auVar45 = pshuflw(auVar44,auVar27,0xe8);
            auVar26._8_4_ = 0xffffffff;
            auVar26._0_8_ = 0xffffffffffffffff;
            auVar26._12_4_ = 0xffffffff;
            auVar26 = (auVar45 | auVar46 & auVar44) ^ auVar26;
            auVar26 = packssdw(auVar26,auVar26);
            if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar5->a[0].u + lVar17) = 0;
            }
            auVar27 = auVar29 & auVar36 | auVar27;
            auVar26 = packssdw(auVar27,auVar27);
            auVar45._8_4_ = 0xffffffff;
            auVar45._0_8_ = 0xffffffffffffffff;
            auVar45._12_4_ = 0xffffffff;
            auVar26 = packssdw(auVar26 ^ auVar45,auVar26 ^ auVar45);
            if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)&pEVar5[1].a[0].zSpan + lVar17 + 4) = 0;
            }
            auVar26 = auVar24 ^ auVar8;
            iVar39 = -(uint)(iVar40 < auVar26._0_4_);
            auVar41._4_4_ = -(uint)(iVar10 < auVar26._4_4_);
            iVar43 = -(uint)(iVar11 < auVar26._8_4_);
            auVar41._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
            auVar28._4_4_ = iVar39;
            auVar28._0_4_ = iVar39;
            auVar28._8_4_ = iVar43;
            auVar28._12_4_ = iVar43;
            auVar35._4_4_ = -(uint)(auVar26._4_4_ == iVar10);
            auVar35._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar26 = auVar35 & auVar28 | auVar41;
            auVar26 = packssdw(auVar26,auVar26);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar26 = packssdw(auVar26 ^ auVar6,auVar26 ^ auVar6);
            if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar5[2].a[0].zName + lVar17 + 4) = 0;
            }
            auVar29 = pshufhw(auVar28,auVar28,0x84);
            auVar36 = pshufhw(auVar35,auVar35,0x84);
            auVar27 = pshufhw(auVar29,auVar41,0x84);
            auVar30._8_4_ = 0xffffffff;
            auVar30._0_8_ = 0xffffffffffffffff;
            auVar30._12_4_ = 0xffffffff;
            auVar30 = (auVar27 | auVar36 & auVar29) ^ auVar30;
            auVar29 = packssdw(auVar30,auVar30);
            if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar5[3].a[0].pExpr + lVar17 + 4) = 0;
            }
            auVar29 = auVar23 ^ auVar8;
            iVar39 = -(uint)(iVar40 < auVar29._0_4_);
            auVar32._4_4_ = -(uint)(iVar10 < auVar29._4_4_);
            iVar43 = -(uint)(iVar11 < auVar29._8_4_);
            auVar32._12_4_ = -(uint)(iVar21 < auVar29._12_4_);
            auVar37._4_4_ = iVar39;
            auVar37._0_4_ = iVar39;
            auVar37._8_4_ = iVar43;
            auVar37._12_4_ = iVar43;
            auVar26 = pshuflw(auVar26,auVar37,0xe8);
            auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar10);
            auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar21);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            in_XMM12 = pshuflw(auVar46 & auVar44,auVar31,0xe8);
            in_XMM12 = in_XMM12 & auVar26;
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            auVar26 = pshuflw(auVar26,auVar32,0xe8);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar44 = (auVar26 | in_XMM12) ^ auVar44;
            auVar26 = packssdw(auVar44,auVar44);
            if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pEVar5[4].a + lVar17 + -4) = 0;
            }
            auVar32 = auVar31 & auVar37 | auVar32;
            auVar26 = packssdw(auVar32,auVar32);
            auVar46._8_4_ = 0xffffffff;
            auVar46._0_8_ = 0xffffffffffffffff;
            auVar46._12_4_ = 0xffffffff;
            auVar26 = packssdw(auVar26 ^ auVar46,auVar26 ^ auVar46);
            if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar5[4].a[0].u + lVar17) = 0;
            }
            auVar26 = auVar22 ^ auVar8;
            iVar40 = -(uint)(iVar40 < auVar26._0_4_);
            auVar42._4_4_ = -(uint)(iVar10 < auVar26._4_4_);
            iVar11 = -(uint)(iVar11 < auVar26._8_4_);
            auVar42._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
            auVar33._4_4_ = iVar40;
            auVar33._0_4_ = iVar40;
            auVar33._8_4_ = iVar11;
            auVar33._12_4_ = iVar11;
            auVar38._4_4_ = -(uint)(auVar26._4_4_ == iVar10);
            auVar38._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar26 = auVar38 & auVar33 | auVar42;
            auVar26 = packssdw(auVar26,auVar26);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            in_XMM11 = packssdw(auVar26 ^ auVar7,auVar26 ^ auVar7);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar5[5].a[0].zSpan + lVar17 + 4) = 0;
            }
            auVar26 = pshufhw(auVar33,auVar33,0x84);
            auVar27 = pshufhw(auVar38,auVar38,0x84);
            auVar29 = pshufhw(auVar26,auVar42,0x84);
            auVar34._8_4_ = 0xffffffff;
            auVar34._0_8_ = 0xffffffffffffffff;
            auVar34._12_4_ = 0xffffffff;
            auVar34 = (auVar29 | auVar27 & auVar26) ^ auVar34;
            auVar26 = packssdw(auVar34,auVar34);
            if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar5[6].a[0].zName + lVar17 + 4) = 0;
            }
            lVar19 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 8;
            auVar25._8_8_ = lVar19 + 8;
            lVar19 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 8;
            auVar24._8_8_ = lVar19 + 8;
            lVar19 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 8;
            auVar23._8_8_ = lVar19 + 8;
            lVar19 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 8;
            auVar22._8_8_ = lVar19 + 8;
            lVar17 = lVar17 + 0x100;
          } while ((ulong)(iVar9 + 7U >> 3) << 8 != lVar17);
        }
      }
      if (db->mallocFailed != '\0') goto LAB_00182eb0;
      local_a8 = (ExprList *)sqlite3DbMallocZero(pParse->db,(long)iVar15 << 2);
      iVar9 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0,(int *)local_a8);
      pTerm->pExpr->iTable = pX->iTable;
LAB_00182f02:
      sqlite3ExprDeleteNN(db,pX);
    }
    else {
LAB_00182eb0:
      iVar9 = 5;
      local_a8 = (ExprList *)0x0;
      if (pX != (Expr *)0x0) goto LAB_00182f02;
    }
    pEVar16 = pTerm->pExpr;
  }
  uVar18 = (uint)(bRev == 0);
  if (iVar9 != 4) {
    uVar18 = bRev;
  }
  iVar40 = pEVar16->iTable;
  sqlite3VdbeAddOp3(p,(uint)(uVar18 == 0) * 4 + 0x20,iVar40,0,0);
  pbVar1 = (byte *)((long)&pWVar3->wsFlags + 1);
  *pbVar1 = *pbVar1 | 8;
  iVar10 = (pLevel->u).in.nIn;
  if (iVar10 == 0) {
    iVar10 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
    pLevel->addrNxt = iVar10;
    iVar10 = (pLevel->u).in.nIn;
  }
  (pLevel->u).in.nIn = iVar15 + iVar10;
  pIVar12 = (InLoop *)
            sqlite3DbReallocOrFree(pParse->db,(pLevel->u).in.aInLoop,(long)(iVar15 + iVar10) * 0x14)
  ;
  (pLevel->u).in.aInLoop = pIVar12;
  if (pIVar12 == (InLoop *)0x0) {
    (pLevel->u).in.nIn = 0;
  }
  else {
    uVar14 = (ulong)pWVar3->nLTerm;
    if (iEq < (int)(uint)pWVar3->nLTerm) {
      pIVar12 = pIVar12 + iVar10;
      local_58 = uVar18 == 0 | 4;
      lVar17 = (long)iEq;
      lVar19 = 0;
      iVar15 = 0;
      iVar10 = iTarget;
      do {
        if (pWVar3->aLTerm[lVar17]->pExpr == pEVar16) {
          if (iVar9 == 1) {
            iVar39 = 0x81;
            iVar11 = iVar10;
            iVar21 = 0;
          }
          else {
            if (local_a8 == (ExprList *)0x0) {
              iVar11 = 0;
            }
            else {
              lVar13 = (long)iVar15;
              iVar15 = iVar15 + 1;
              iVar11 = *(int *)((long)local_a8 + lVar13 * 4);
            }
            iVar39 = 0x5a;
            iVar21 = iVar10;
          }
          iVar11 = sqlite3VdbeAddOp3(p,iVar39,iVar40,iVar11,iVar21);
          pIVar12->addrInTop = iVar11;
          sqlite3VdbeAddOp3(p,0x32,iVar10,0,0);
          if (lVar19 == 0) {
            pIVar12->iCur = iVar40;
            pIVar12->eEndLoopOp = local_58;
            if ((iEq < 1) || (uVar18 = pWVar3->wsFlags, (uVar18 >> 10 & 1) != 0)) {
              pIVar12->nPrefix = 0;
            }
            else {
              pIVar12->iBase = iTarget - iEq;
              pIVar12->nPrefix = iEq;
              pWVar3->wsFlags = uVar18 | 0x40000;
            }
          }
          else {
            pIVar12->eEndLoopOp = 0xab;
          }
          pIVar12 = pIVar12 + 1;
          uVar14 = (ulong)pWVar3->nLTerm;
        }
        lVar17 = lVar17 + 1;
        lVar19 = lVar19 + -1;
        iVar10 = iVar10 + 1;
      } while (lVar17 < (long)uVar14);
    }
  }
  if (local_a8 != (ExprList *)0x0) {
    sqlite3DbFreeNN(pParse->db,local_a8);
  }
LAB_00183123:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap);
        pTerm->pExpr->iTable = pX->iTable;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            testcase( nEq>1 );  /* Happens with a UNIQUE index on ROWID */
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}